

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cpp
# Opt level: O3

string * __thiscall IPAddress::GetString_abi_cxx11_(string *__return_storage_ptr__,IPAddress *this)

{
  uint uVar1;
  size_t sVar2;
  char buf [16];
  char acStack_28 [24];
  
  uVar1 = this->address;
  sprintf(acStack_28,"%u.%u.%u.%u",(ulong)(uVar1 >> 0x18),(ulong)(uVar1 >> 0x10 & 0xff),
          (ulong)(uVar1 >> 8 & 0xff),(ulong)(uVar1 & 0xff));
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar2 = strlen(acStack_28);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,acStack_28,acStack_28 + sVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string IPAddress::GetString() const
{
	char buf[16];
	unsigned char o1, o2, o3, o4;
	o1 = (this->address & 0xFF000000) >> 24;
	o2 = (this->address & 0x00FF0000) >> 16;
	o3 = (this->address & 0x0000FF00) >> 8;
	o4 = this->address & 0x000000FF;
	std::sprintf(buf, "%u.%u.%u.%u", o1, o2, o3, o4);
	return std::string(buf);
}